

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

Cleanup<std::function<void_()>_> *
fork_torture::setup_fork_testing
          (Cleanup<std::function<void_()>_> *__return_storage_ptr__,int *argc,char ***argv)

{
  int iVar1;
  code *pcVar2;
  undefined8 *puVar3;
  long *plVar4;
  code *pcVar5;
  undefined8 uVar6;
  char *pcVar7;
  _union_1457 local_c0;
  __cpu_mask local_b8;
  long alStack_b0 [15];
  undefined4 local_38;
  
  if (1 < *argc) {
    local_c0.sa_handler = (__sighandler_t)alStack_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"--with-fork-torture","");
    iVar1 = std::__cxx11::string::compare((char *)&local_c0);
    if (local_c0.sa_handler != (__sighandler_t)alStack_b0) {
      operator_delete(local_c0.sa_handler,alStack_b0[0] + 1);
    }
    if (iVar1 == 0) {
      puts("Enabling fork torturing!!!!");
      iVar1 = sem_init((sem_t *)single_step_req,0,0);
      if (iVar1 == 0) {
        iVar1 = sem_init((sem_t *)single_step_ack,0,0);
        if (iVar1 == 0) {
          alStack_b0[0xb] = 0;
          alStack_b0[0xc] = 0;
          alStack_b0[9] = 0;
          alStack_b0[10] = 0;
          alStack_b0[7] = 0;
          alStack_b0[8] = 0;
          alStack_b0[5] = 0;
          alStack_b0[6] = 0;
          alStack_b0[3] = 0;
          alStack_b0[4] = 0;
          alStack_b0[1] = 0;
          alStack_b0[2] = 0;
          local_b8 = 0;
          alStack_b0[0] = 0;
          alStack_b0[0xd] = 0;
          local_c0 = (_union_1457)0x1;
          iVar1 = sched_setaffinity(0,0x80,(cpu_set_t *)&local_c0);
          if (iVar1 != 0) {
            pcVar7 = "Check failed: sched_setaffinity(0, sizeof(mask), &mask) == 0\n";
            uVar6 = 0x3d;
            goto LAB_00115000;
          }
          memset(&local_b8,0,0x90);
          local_c0.sa_handler = step_handler;
          local_38 = 0x10000004;
          iVar1 = sigaction(5,(sigaction *)&local_c0,(sigaction *)0x0);
          if (iVar1 == 0) {
            puVar3 = (undefined8 *)operator_new(8);
            *puVar3 = 0;
            local_c0.sa_handler = (__sighandler_t)operator_new(0x10);
            *(undefined ***)local_c0.sa_handler = &PTR___State_001628e0;
            std::thread::_M_start_thread(puVar3,&local_c0,0);
            if (local_c0.sa_handler != (__sighandler_t)0x0) {
              (**(code **)(*(long *)local_c0.sa_handler + 8))();
            }
            xsem_wait((sem_t *)single_step_ack);
            plVar4 = (long *)MallocExtension::instance();
            (**(code **)(*plVar4 + 0x68))(plVar4);
            raise(5);
            running_fork_testing = 1;
            pcVar2 = std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:2230:50)>
                     ::_M_manager;
            pcVar5 = std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:2230:50)>
                     ::_M_invoke;
            goto LAB_00114e51;
          }
          pcVar7 = "Check failed: sigaction(SIGTRAP, &sa, nullptr) == 0\n";
        }
        else {
          pcVar7 = "Check failed: sem_init(&single_step_ack, 0, 0) == 0\n";
        }
      }
      else {
        pcVar7 = "Check failed: sem_init(&single_step_req, 0, 0) == 0\n";
      }
      uVar6 = 0x34;
LAB_00115000:
      syscall(1,2,pcVar7,uVar6);
      abort();
    }
  }
  puts("Not enabling fork torture");
  pcVar2 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:2137:52)>
           ::_M_manager;
  pcVar5 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:2137:52)>
           ::_M_invoke;
LAB_00114e51:
  *(undefined8 *)&(__return_storage_ptr__->callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->callback_).super__Function_base._M_functor + 8) =
       0;
  (__return_storage_ptr__->callback_)._M_invoker = pcVar5;
  (__return_storage_ptr__->callback_).super__Function_base._M_manager = pcVar2;
  return __return_storage_ptr__;
}

Assistant:

tcmalloc::Cleanup<std::function<void()>> setup_fork_testing(int* argc, char *** argv) {
  if (*argc < 2 || (*argv)[1] != std::string("--with-fork-torture")) {
    printf("Not enabling fork torture\n");
    return tcmalloc::Cleanup(std::function<void()>([] () {}));
  }
  printf("Enabling fork torturing!!!!\n");

  CHECK(sem_init(&single_step_req, 0, 0) == 0);
  CHECK(sem_init(&single_step_ack, 0, 0) == 0);

  // First, we set cpu affinity mask to only core 0. It helps
  // performance, but mostly it is required so that main thread never
  // runs when real-time helper thread is runnable.
  {
    cpu_set_t mask;
    memset(&mask, 0, sizeof(mask));
    CPU_SET(0, &mask);
    CHECK(sched_setaffinity(0, sizeof(mask), &mask) == 0);
  }

  // Then we prepare SIGTRAP signal handler.
  {
    struct sigaction sa;
    memset(&sa, 0, sizeof(sa));
    sa.sa_sigaction = step_handler;
    sa.sa_flags = SA_RESTART | SA_SIGINFO;
    CHECK(sigaction(SIGTRAP, &sa, nullptr) == 0);
  }

  std::thread* t = new std::thread([] () {
    // Helper thread first makes itself real-time.
    struct sched_param p;
    memset(&p, 0, sizeof(p));
    p.sched_priority = 1;
    CHECK(sched_setscheduler(0, SCHED_FIFO, &p) == 0);

    // And then signals its readiness.
    sem_post(&single_step_ack);

    MallocExtension::instance()->MarkThreadIdle();

    constexpr int kPeriod = 1 << 10;
    int cnt = kPeriod;

    while (true) {
      xsem_wait(&single_step_req);
      // Lets print something every few iterations to help us see if
      // progress is being made.
      if (--cnt <= 0) {
        write(2, "$", 1);
        cnt = kPeriod;
      }

      // Once we're about to fork, we need to flag "in_fork" mode and
      // unblock main thread.
      in_fork = true;
      sem_post(&single_step_ack);

      int child = fork();
      CHECK(child >= 0);
      if (child == 0) {
        // Child runs some mallocs and exits.
        (::operator delete)((::operator new)(32));
        (::operator delete)((::operator new)(1024));
        (::operator delete)((::operator new)(2 << 20));
        _exit(0);
      }

      // Parent asserts that child exited cleanly.
      int status = 0;
      int ret = waitpid(child, &status, 0);
      CHECK(ret == child);
      CHECK(status == 0);

      // And we un-mark in_fork mode, so that main thread continues to
      // cooperation via sem_{post/wait} on single_step_{req,ack}
      // semaphores.
      num_forks++;
      in_fork = false;
    }
  });
  (void)t; // leak
  xsem_wait(&single_step_ack);

  MallocExtension::instance()->MarkThreadIdle();

  // First SIGTRAP runs the signal handler and signal handler sets up
  // EFLAGS to single-step.
  raise(SIGTRAP);

  // This is a flag for a test that is not compatible with
  // single-stepping. NewHandler test doesn't work because it enables
  // oom simulation at some point which, naturally, crashes the forked
  // child.
  running_fork_testing = true;

  return tcmalloc::Cleanup(std::function<void()>([] () {
    stepping_stop_requested = true;
    while (!*const_cast<volatile bool*>(&stepping_stop_acked)) {
      // no-op
    }
    // In the clean up, we're ensuring that in_fork turns to false, so
    // that fork/waitpid isn't stuck.
    printf("Done with fork torturing! Number of forks performed: %lld\n", (long long)num_forks);
  }));
}